

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Cachesize(sqlite3_pcache *p,int nMax)

{
  long lVar1;
  uint in_ESI;
  long *in_RDI;
  PGroup *pGroup;
  u32 n;
  PCache1 *pCache;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)((long)in_RDI + 0x1c) != 0) {
    lVar1 = *in_RDI;
    local_1c = in_ESI;
    if ((uint)((0x7fff0000 - *(int *)(lVar1 + 8)) + *(int *)((long)in_RDI + 0x24)) < in_ESI) {
      local_1c = (0x7fff0000 - *(int *)(lVar1 + 8)) + *(int *)((long)in_RDI + 0x24);
    }
    *(uint *)(lVar1 + 8) = (local_1c - *(int *)((long)in_RDI + 0x24)) + *(int *)(lVar1 + 8);
    *(int *)(lVar1 + 0x10) = (*(int *)(lVar1 + 8) + 10) - *(int *)(lVar1 + 0xc);
    *(uint *)((long)in_RDI + 0x24) = local_1c;
    *(uint *)(in_RDI + 5) = (uint)(*(int *)((long)in_RDI + 0x24) * 9) / 10;
    pcache1EnforceMaxPage((PCache1 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

static void pcache1Cachesize(sqlite3_pcache *p, int nMax){
  PCache1 *pCache = (PCache1 *)p;
  u32 n;
  assert( nMax>=0 );
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    pcache1EnterMutex(pGroup);
    n = (u32)nMax;
    if( n > 0x7fff0000 - pGroup->nMaxPage + pCache->nMax ){
      n = 0x7fff0000 - pGroup->nMaxPage + pCache->nMax;
    }
    pGroup->nMaxPage += (n - pCache->nMax);
    pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
    pCache->nMax = n;
    pCache->n90pct = pCache->nMax*9/10;
    pcache1EnforceMaxPage(pCache);
    pcache1LeaveMutex(pGroup);
  }
}